

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void __thiscall
spirv_cross::SPIRVariable::SPIRVariable
          (SPIRVariable *this,TypeID basetype_,StorageClass storage_,ID initializer_,
          VariableID basevariable_)

{
  (this->super_IVariant).self.id = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRVariable_003a67e8;
  *(uint32_t *)&(this->super_IVariant).field_0xc = basetype_.id;
  this->storage = storage_;
  this->decoration = 0;
  (this->initializer).id = initializer_.id;
  (this->basevariable).id = basevariable_.id;
  (this->dereference_chain).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->dereference_chain).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->dereference_chain).stack_storage;
  (this->dereference_chain).buffer_capacity = 8;
  this->compat_builtin = false;
  this->statically_assigned = false;
  (this->static_expression).id = 0;
  (this->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = 0;
  (this->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
       (TypedID<(spirv_cross::Types)0> *)&(this->dependees).stack_storage;
  (this->dependees).buffer_capacity = 8;
  this->forwardable = true;
  this->parameter = (Parameter *)0x0;
  this->deferred_declaration = false;
  this->phi_variable = false;
  this->allocate_temporary_copy = false;
  this->remapped_variable = false;
  this->loop_variable = false;
  this->loop_variable_enable = false;
  this->remapped_components = 0;
  this->dominator = 0;
  return;
}

Assistant:

TypedID(uint32_t id_)
	    : id(id_)
	{
	}